

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  data_ptr_t pdVar1;
  idx_t row_idx;
  ulong row_offset;
  idx_t i;
  idx_t iVar2;
  string_t sVar3;
  
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  row_offset = 0;
  for (iVar2 = 0; approved_tuple_count != iVar2; iVar2 = iVar2 + 1) {
    row_idx = iVar2;
    if (sel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)sel->sel_vector[iVar2];
    }
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,true,true>
              (this,plain_data,defines,row_idx - row_offset,row_offset);
    if (this->column_schema->max_define == (ulong)defines[row_idx]) {
      sVar3 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
      *(long *)(pdVar1 + row_idx * 0x10) = sVar3.value._0_8_;
      *(long *)(pdVar1 + row_idx * 0x10 + 8) = sVar3.value._8_8_;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    row_offset = row_idx + 1;
  }
  if (row_offset <= num_values && num_values - row_offset != 0) {
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,true,true>
              (this,plain_data,defines,num_values - row_offset,row_offset);
    return;
  }
  return;
}

Assistant:

void PlainSelectTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                  const uint64_t num_values, Vector &result, const SelectionVector &sel,
	                                  idx_t approved_tuple_count) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		auto &result_mask = FlatVector::Validity(result);
		idx_t current_entry = 0;
		for (idx_t i = 0; i < approved_tuple_count; i++) {
			auto next_entry = sel.get_index(i);
			D_ASSERT(current_entry <= next_entry);
			// perform any skips forward if required
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             next_entry - current_entry, current_entry);
			// read this row
			if (HAS_DEFINES && defines[next_entry] != MaxDefine()) {
				result_mask.SetInvalid(next_entry);
			} else {
				result_ptr[next_entry] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
			}
			current_entry = next_entry + 1;
		}
		if (current_entry < num_values) {
			// skip forward to the end of where we are selecting
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             num_values - current_entry, current_entry);
		}
	}